

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrfile.c
# Opt level: O3

int file_write(int hdl,void *buffer,long nbytes)

{
  __off64_t __off;
  int iVar1;
  size_t sVar2;
  
  if (handleTable[hdl].last_io_op == 1) {
    __off = handleTable[hdl].currentpos;
    iVar1 = fseeko64((FILE *)handleTable[hdl].fileptr,__off,0);
    if (iVar1 != 0) {
      return 0x74;
    }
    handleTable[hdl].currentpos = __off;
  }
  sVar2 = fwrite(buffer,1,nbytes,(FILE *)handleTable[hdl].fileptr);
  iVar1 = 0x6a;
  if (sVar2 == nbytes) {
    handleTable[hdl].currentpos = handleTable[hdl].currentpos + nbytes;
    handleTable[hdl].last_io_op = 2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int file_write(int hdl, void *buffer, long nbytes)
/*
  write bytes at the current position in the file
*/
{
    if (handleTable[hdl].last_io_op == IO_READ) 
    {
        if (file_seek(hdl, handleTable[hdl].currentpos))
            return(SEEK_ERROR);
    }

    if((long) fwrite(buffer, 1, nbytes, handleTable[hdl].fileptr) != nbytes)
        return(WRITE_ERROR);

    handleTable[hdl].currentpos += nbytes;
    handleTable[hdl].last_io_op = IO_WRITE;
    return(0);
}